

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Bitmask exprSelectUsage(WhereMaskSet *pMaskSet,Select *pS)

{
  ushort uVar1;
  SrcList *pSVar2;
  Bitmask BVar3;
  Bitmask BVar4;
  Bitmask BVar5;
  Bitmask BVar6;
  Bitmask BVar7;
  long lVar8;
  ushort *puVar9;
  ulong uVar10;
  
  uVar10 = 0;
  for (; pS != (Select *)0x0; pS = pS->pPrior) {
    pSVar2 = pS->pSrc;
    BVar3 = sqlite3WhereExprListUsage(pMaskSet,pS->pEList);
    BVar4 = sqlite3WhereExprListUsage(pMaskSet,pS->pGroupBy);
    BVar5 = sqlite3WhereExprListUsage(pMaskSet,pS->pOrderBy);
    BVar6 = sqlite3WhereExprUsage(pMaskSet,pS->pWhere);
    BVar7 = sqlite3WhereExprUsage(pMaskSet,pS->pHaving);
    uVar10 = BVar7 | uVar10 | BVar6 | BVar5 | BVar4 | BVar3;
    if (pSVar2 != (SrcList *)0x0) {
      puVar9 = (ushort *)&pSVar2->a[0].fg.field_0x1;
      for (lVar8 = 0; lVar8 < pSVar2->nSrc; lVar8 = lVar8 + 1) {
        uVar1 = *puVar9;
        if ((uVar1 & 4) != 0) {
          BVar3 = exprSelectUsage(pMaskSet,(Select *)**(undefined8 **)((long)puVar9 + 0x27));
          uVar10 = uVar10 | BVar3;
          uVar1 = *puVar9;
        }
        if ((uVar1 >> 0xb & 1) == 0) {
          BVar3 = sqlite3WhereExprUsage(pMaskSet,*(Expr **)((long)puVar9 + 0x1f));
          uVar10 = uVar10 | BVar3;
          uVar1 = *puVar9;
        }
        if ((uVar1 & 8) != 0) {
          BVar3 = sqlite3WhereExprListUsage(pMaskSet,*(ExprList **)((long)puVar9 + 0xf));
          uVar10 = uVar10 | BVar3;
        }
        puVar9 = puVar9 + 0x24;
      }
    }
  }
  return uVar10;
}

Assistant:

static Bitmask exprSelectUsage(WhereMaskSet *pMaskSet, Select *pS){
  Bitmask mask = 0;
  while( pS ){
    SrcList *pSrc = pS->pSrc;
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pEList);
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pGroupBy);
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pOrderBy);
    mask |= sqlite3WhereExprUsage(pMaskSet, pS->pWhere);
    mask |= sqlite3WhereExprUsage(pMaskSet, pS->pHaving);
    if( ALWAYS(pSrc!=0) ){
      int i;
      for(i=0; i<pSrc->nSrc; i++){
        if( pSrc->a[i].fg.isSubquery ){
          mask |= exprSelectUsage(pMaskSet, pSrc->a[i].u4.pSubq->pSelect);
        }
        if( pSrc->a[i].fg.isUsing==0 ){
          mask |= sqlite3WhereExprUsage(pMaskSet, pSrc->a[i].u3.pOn);
        }
        if( pSrc->a[i].fg.isTabFunc ){
          mask |= sqlite3WhereExprListUsage(pMaskSet, pSrc->a[i].u1.pFuncArg);
        }
      }
    }
    pS = pS->pPrior;
  }
  return mask;
}